

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

UnitTest * testing::UnitTest::GetInstance(void)

{
  int iVar1;
  
  if (GetInstance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&GetInstance()::instance);
    if (iVar1 != 0) {
      UnitTest(&GetInstance::instance);
      __cxa_atexit(~UnitTest,&GetInstance::instance,&__dso_handle);
      __cxa_guard_release(&GetInstance()::instance);
    }
  }
  return &GetInstance::instance;
}

Assistant:

UnitTest* UnitTest::GetInstance() {
  // When compiled with MSVC 7.1 in optimized mode, destroying the
  // UnitTest object upon exiting the program messes up the exit code,
  // causing successful tests to appear failed.  We have to use a
  // different implementation in this case to bypass the compiler bug.
  // This implementation makes the compiler happy, at the cost of
  // leaking the UnitTest object.

  // CodeGear C++Builder insists on a public destructor for the
  // default implementation.  Use this implementation to keep good OO
  // design with private destructor.

#if (_MSC_VER == 1310 && !defined(_DEBUG)) || defined(__BORLANDC__)
  static UnitTest* const instance = new UnitTest;
  return instance;
#else
  static UnitTest instance;
  return &instance;
#endif  // (_MSC_VER == 1310 && !defined(_DEBUG)) || defined(__BORLANDC__)
}